

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O2

void __thiscall Assimp::IFC::Schema_2x3::IfcRelConnects::~IfcRelConnects(IfcRelConnects *this)

{
  IfcRoot::~IfcRoot((IfcRoot *)this,&PTR_construction_vtable_24__00767450);
  return;
}

Assistant:

IfcRelConnects() : Object("IfcRelConnects") {}